

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Reference>
          (CrateReader *this,vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *d)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  uint64_t n;
  ostringstream ss_e;
  uint64_t local_1f0;
  long *local_1e8;
  long local_1d8 [2];
  undefined1 local_1c8 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  bool local_c8;
  storage_t<tinyusdz::Path::PathType> local_c4;
  bool local_c0;
  double local_b8;
  double dStack_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_a8;
  CrateReader *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (d == (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)0x0) {
    return false;
  }
  local_1f0 = 0;
  bVar2 = StreamReader::read8(this->_sr,&local_1f0);
  if (bVar2) {
    if ((this->_config).maxArrayElements < local_1f0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x5f2);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar6 = "Too many array elements.";
      lVar5 = 0x18;
    }
    else {
      uVar4 = local_1f0 * 0x150 + this->_memoryUsage;
      this->_memoryUsage = uVar4;
      if (uVar4 <= (this->_config).maxMemoryBudget) {
        if (local_1f0 == 0) {
          return true;
        }
        pcVar1 = local_1c8 + 0xf0;
        local_48 = 0;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0x3ff00000;
        uVar4 = 0;
        local_50 = this;
        do {
          local_1c8._0_8_ = local_1c8 + 0x10;
          local_1c8._8_8_ = 0;
          local_1c8[0x10] = '\0';
          local_1c8._32_8_ = local_1c8 + 0x30;
          local_1c8._40_8_ = 0;
          local_1c8[0x30] = '\0';
          local_1c8._64_8_ = local_1c8 + 0x50;
          local_1c8._72_8_ = 0;
          local_1c8[0x50] = '\0';
          local_1c8._96_8_ = local_1c8 + 0x70;
          local_1c8._104_8_ = 0;
          local_158._M_local_buf[0] = '\0';
          local_148._M_p = local_1c8 + 0x90;
          local_140 = 0;
          local_138._M_local_buf[0] = '\0';
          local_128._M_p = local_1c8 + 0xb0;
          local_120 = 0;
          local_118._M_local_buf[0] = '\0';
          local_108._M_p = local_1c8 + 0xd0;
          local_100 = 0;
          local_f8._M_local_buf[0] = '\0';
          local_e0 = 0;
          local_d8._M_local_buf[0] = '\0';
          local_c8 = false;
          local_c4 = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_c0 = false;
          local_b8 = (double)CONCAT44(uStack_44,local_48);
          dStack_b0 = (double)CONCAT44(uStack_3c,uStack_40);
          local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)(local_1c8 + 0x128);
          local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_e8._M_p = pcVar1;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar2 = ReadReference(local_50,(Reference *)local_1c8);
          if (!bVar2) {
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                        *)(local_1c8 + 0x120),
                       (_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent);
            if (local_e8._M_p != pcVar1) {
              operator_delete(local_e8._M_p,
                              CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]
                                      ) + 1);
            }
            if (local_108._M_p != local_1c8 + 0xd0) {
              operator_delete(local_108._M_p,
                              CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]
                                      ) + 1);
            }
            if (local_128._M_p != local_1c8 + 0xb0) {
              operator_delete(local_128._M_p,
                              CONCAT71(local_118._M_allocated_capacity._1_7_,
                                       local_118._M_local_buf[0]) + 1);
            }
            if (local_148._M_p != local_1c8 + 0x90) {
              operator_delete(local_148._M_p,
                              CONCAT71(local_138._M_allocated_capacity._1_7_,
                                       local_138._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
              operator_delete((void *)local_1c8._96_8_,
                              CONCAT71(local_158._M_allocated_capacity._1_7_,
                                       local_158._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
              operator_delete((void *)local_1c8._64_8_,
                              CONCAT71(local_1c8._81_7_,local_1c8[0x50]) + 1);
            }
            if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
              operator_delete((void *)local_1c8._32_8_,
                              CONCAT71(local_1c8._49_7_,local_1c8[0x30]) + 1);
            }
            if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) {
              return false;
            }
            operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
            return false;
          }
          ::std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>::
          emplace_back<tinyusdz::Reference&>
                    ((vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>> *)d,
                     (Reference *)local_1c8);
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                      *)(local_1c8 + 0x120),
                     (_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent);
          if (local_e8._M_p != pcVar1) {
            operator_delete(local_e8._M_p,
                            CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                            + 1);
          }
          if (local_108._M_p != local_1c8 + 0xd0) {
            operator_delete(local_108._M_p,
                            CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0])
                            + 1);
          }
          if (local_128._M_p != local_1c8 + 0xb0) {
            operator_delete(local_128._M_p,
                            CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]
                                    ) + 1);
          }
          if (local_148._M_p != local_1c8 + 0x90) {
            operator_delete(local_148._M_p,
                            CONCAT71(local_138._M_allocated_capacity._1_7_,local_138._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
            operator_delete((void *)local_1c8._96_8_,
                            CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
            operator_delete((void *)local_1c8._64_8_,CONCAT71(local_1c8._81_7_,local_1c8[0x50]) + 1)
            ;
          }
          if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
            operator_delete((void *)local_1c8._32_8_,CONCAT71(local_1c8._49_7_,local_1c8[0x30]) + 1)
            ;
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < local_1f0);
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x5f5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar6 = "Reached to max memory budget.";
      lVar5 = 0x1d;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x5ed);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar6 = "Failed to read the number of array elements.";
    lVar5 = 0x2c;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar6,lVar5);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1e8);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  return false;
}

Assistant:

bool CrateReader::ReadArray(std::vector<Reference> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (!_sr->read8(&n)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    return false;
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Reference) * n);

  for (size_t i = 0; i < n; i++) {
    Reference p;
    if (!ReadReference(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}